

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_selist.c
# Opt level: O3

void test_insert_delete_gives_null(CuTest *tc)

{
  int iVar1;
  selist *ql;
  selist *local_20;
  
  local_20 = (selist *)0x0;
  iVar1 = selist_empty((selist *)0x0);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_selist.c",
             0x85,(char *)0x0,1,iVar1);
  selist_push(&local_20,
              "Lorem ipsum dolor sit amet, consectetur adipisicing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua."
             );
  iVar1 = selist_empty(local_20);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_selist.c",
             0x87,(char *)0x0,0,iVar1);
  selist_delete(&local_20,0);
  CuAssertPtrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_selist.c",
             0x89,(char *)0x0,(void *)0x0,local_20);
  selist_free(local_20);
  return;
}

Assistant:

static void test_insert_delete_gives_null(CuTest * tc)
{
    struct selist *ql = NULL;
    CuAssertIntEquals(tc, 1, selist_empty(ql));
    selist_push(&ql, (void *)lipsum);
    CuAssertIntEquals(tc, 0, selist_empty(ql));
    selist_delete(&ql, 0);
    CuAssertPtrEquals(tc, NULL, ql);
    selist_free(ql);
}